

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O1

void __thiscall
fasttext::ProductQuantizer::MStep
          (ProductQuantizer *this,real *x0,real *centroids,uint8_t *codes,int32_t d,int32_t n)

{
  real *prVar1;
  size_t sVar2;
  byte bVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined8 uVar12;
  undefined1 auVar13 [16];
  byte bVar14;
  byte bVar15;
  pointer piVar16;
  long lVar17;
  ulong uVar18;
  real *prVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined4 in_XMM6_Db;
  undefined8 in_XMM6_Qb;
  vector<int,_std::allocator<int>_> nelts;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>,_double>
  __aurng;
  allocator_type local_81;
  real *local_80;
  ulong local_78;
  long local_70;
  size_t local_68;
  vector<int,_std::allocator<int>_> local_60;
  long local_48;
  minstd_rand *local_40;
  value_type_conflict1 local_34;
  
  local_34 = 0;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,(long)this->ksub_,&local_34,&local_81);
  lVar17 = (long)d;
  sVar2 = lVar17 * 4;
  local_80 = centroids;
  local_48 = lVar17;
  memset(centroids,0,(long)this->ksub_ * sVar2);
  if (0 < n) {
    uVar18 = 0;
    do {
      bVar3 = codes[uVar18];
      if (0 < d) {
        iVar21 = (uint)bVar3 * d;
        uVar22 = 0;
        do {
          local_80[(long)iVar21 + uVar22] = x0[uVar22] + local_80[(long)iVar21 + uVar22];
          uVar22 = uVar22 + 1;
        } while ((uint)d != uVar22);
      }
      local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[bVar3] =
           local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[bVar3] + 1;
      uVar18 = uVar18 + 1;
      x0 = x0 + lVar17;
    } while (uVar18 != (uint)n);
  }
  iVar21 = this->ksub_;
  if (0 < (long)iVar21) {
    auVar23 = vpbroadcastq_avx512vl();
    lVar20 = 0;
    auVar10 = vpmovsxbq_avx2(ZEXT416(0x7060504));
    auVar11 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    prVar19 = local_80;
    do {
      if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar20] != 0 && 0 < d) {
        auVar28._0_4_ =
             (float)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar20];
        auVar28._4_4_ = auVar28._0_4_;
        auVar28._8_4_ = auVar28._0_4_;
        auVar28._12_4_ = auVar28._0_4_;
        auVar28._16_4_ = auVar28._0_4_;
        auVar28._20_4_ = auVar28._0_4_;
        auVar28._24_4_ = auVar28._0_4_;
        auVar28._28_4_ = auVar28._0_4_;
        uVar18 = 0;
        do {
          auVar24 = vpbroadcastq_avx512vl();
          auVar25 = vpor_avx2(auVar24,auVar10);
          auVar24 = vpor_avx2(auVar24,auVar11);
          uVar12 = vpcmpuq_avx512vl(auVar24,auVar23,2);
          bVar15 = (byte)uVar12;
          uVar12 = vpcmpuq_avx512vl(auVar25,auVar23,2);
          bVar14 = (byte)uVar12;
          bVar3 = bVar14 << 4;
          prVar1 = prVar19 + uVar18;
          auVar25._4_4_ = (uint)((bVar15 & 2) >> 1) * (int)prVar1[1];
          auVar25._0_4_ = (uint)(bVar15 & 1) * (int)*prVar1;
          auVar25._8_4_ = (uint)((bVar15 & 4) >> 2) * (int)prVar1[2];
          auVar25._12_4_ = (uint)((bVar15 & 0xf) >> 3) * (int)prVar1[3];
          auVar25._16_4_ = (uint)(bVar14 & 1) * (int)prVar1[4];
          auVar25._20_4_ = (uint)(bVar3 >> 5 & 1) * (int)prVar1[5];
          auVar25._24_4_ = (uint)(bVar3 >> 6 & 1) * (int)prVar1[6];
          auVar25._28_4_ = (uint)(bVar3 >> 7) * (int)prVar1[7];
          auVar25 = vdivps_avx(auVar25,auVar28);
          prVar1 = prVar19 + uVar18;
          bVar5 = (bool)((bVar15 & 2) >> 1);
          bVar6 = (bool)((bVar15 & 4) >> 2);
          bVar7 = (bool)((bVar15 & 0xf) >> 3);
          bVar8 = (bool)(bVar3 >> 5 & 1);
          bVar9 = (bool)(bVar3 >> 6 & 1);
          *prVar1 = (real)((uint)(bVar15 & 1) * auVar25._0_4_ |
                          (uint)!(bool)(bVar15 & 1) * (int)*prVar1);
          prVar1[1] = (real)((uint)bVar5 * auVar25._4_4_ | (uint)!bVar5 * (int)prVar1[1]);
          prVar1[2] = (real)((uint)bVar6 * auVar25._8_4_ | (uint)!bVar6 * (int)prVar1[2]);
          prVar1[3] = (real)((uint)bVar7 * auVar25._12_4_ | (uint)!bVar7 * (int)prVar1[3]);
          prVar1[4] = (real)((uint)(bVar14 & 1) * auVar25._16_4_ |
                            (uint)!(bool)(bVar14 & 1) * (int)prVar1[4]);
          prVar1[5] = (real)((uint)bVar8 * auVar25._20_4_ | (uint)!bVar8 * (int)prVar1[5]);
          prVar1[6] = (real)((uint)bVar9 * auVar25._24_4_ | (uint)!bVar9 * (int)prVar1[6]);
          prVar1[7] = (real)((uint)(bVar3 >> 7) * auVar25._28_4_ |
                            (uint)!(bool)(bVar3 >> 7) * (int)prVar1[7]);
          uVar18 = uVar18 + 8;
        } while ((d + 7U & 0xfffffff8) != uVar18);
      }
      lVar20 = lVar20 + 1;
      prVar19 = prVar19 + lVar17;
    } while (lVar20 != iVar21);
  }
  local_78 = (ulong)(uint)d;
  local_68 = sVar2;
  if (0 < this->ksub_) {
    local_40 = &this->rng;
    lVar17 = 0;
    prVar19 = local_80;
    do {
      if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar17] == 0) {
        iVar21 = 0;
        local_70 = lVar17;
        while( true ) {
          dVar26 = std::
                   generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
                             (local_40);
          piVar16 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((dVar26 + 0.0) * (double)(n - this->ksub_) <
              (double)(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar21] + -1)) break;
          iVar21 = (iVar21 + 1) % this->ksub_;
        }
        prVar1 = local_80 + iVar21 * (int)local_78;
        memcpy(local_80 + local_70 * local_48,prVar1,local_68);
        if (0 < (int)local_78) {
          lVar17 = 0;
          do {
            auVar27._0_4_ = (float)(int)(((uint)lVar17 & 2) - 1);
            auVar27._8_8_ = in_XMM6_Qb;
            auVar27._4_4_ = in_XMM6_Db;
            auVar13 = vfmadd213ss_fma(ZEXT416((uint)this->eps_),auVar27,
                                      ZEXT416(*(uint *)((long)prVar19 + lVar17 * 2)));
            *(int *)((long)prVar19 + lVar17 * 2) = auVar13._0_4_;
            auVar13 = vfnmadd213ss_fma(ZEXT416((uint)this->eps_),auVar27,
                                       ZEXT416(*(uint *)((long)prVar1 + lVar17 * 2)));
            *(int *)((long)prVar1 + lVar17 * 2) = auVar13._0_4_;
            lVar17 = lVar17 + 2;
          } while ((ulong)(uint)d * 2 != lVar17);
        }
        iVar4 = piVar16[iVar21];
        piVar16[local_70] = iVar4 / 2;
        piVar16[iVar21] = piVar16[iVar21] - iVar4 / 2;
        lVar17 = local_70;
      }
      lVar17 = lVar17 + 1;
      prVar19 = (real *)((long)prVar19 + local_68);
    } while (lVar17 < this->ksub_);
  }
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ProductQuantizer::MStep(const real* x0, real* centroids,
                             const uint8_t* codes,
                             int32_t d, int32_t n) {
  std::vector<int32_t> nelts(ksub_, 0);
  memset(centroids, 0, sizeof(real) * d * ksub_);
  const real* x = x0;
  for (auto i = 0; i < n; i++) {
    auto k = codes[i];
    real* c = centroids + k * d;
    for (auto j = 0; j < d; j++) {
      c[j] += x[j];
    }
    nelts[k]++;
    x += d;
  }

  real* c = centroids;
  for (auto k = 0; k < ksub_; k++) {
    real z = (real) nelts[k];
    if (z != 0) {
      for (auto j = 0; j < d; j++) {
        c[j] /= z;
      }
    }
    c += d;
  }

  std::uniform_real_distribution<> runiform(0,1);
  for (auto k = 0; k < ksub_; k++) {
    if (nelts[k] == 0) {
      int32_t m = 0;
      while (runiform(rng) * (n - ksub_) >= nelts[m] - 1) {
        m = (m + 1) % ksub_;
      }
      memcpy(centroids + k * d, centroids + m * d, sizeof(real) * d);
      for (auto j = 0; j < d; j++) {
        int32_t sign = (j % 2) * 2 - 1;
        centroids[k * d + j] += sign * eps_;
        centroids[m * d + j] -= sign * eps_;
      }
      nelts[k] = nelts[m] / 2;
      nelts[m] -= nelts[k];
    }
  }
}